

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_jsonmodelserialiser.cpp
# Opt level: O2

void __thiscall tst_JsonModelSerialiser::autoParent(tst_JsonModelSerialiser *this)

{
  char cVar1;
  QObject *this_00;
  JsonModelSerialiser *this_01;
  QSignalSpy testItemDestroyedSpy;
  
  this_00 = (QObject *)operator_new(0x10);
  QObject::QObject(this_00,(QObject *)0x0);
  this_01 = (JsonModelSerialiser *)operator_new(0x18);
  JsonModelSerialiser::JsonModelSerialiser(this_01,this_00);
  QSignalSpy::QSignalSpy(&testItemDestroyedSpy,(QObject *)this_01,"2destroyed(QObject *)");
  cVar1 = QTest::qVerify(testItemDestroyedSpy.sig.d.size != 0,"testItemDestroyedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_JsonModelSerialiser/tst_jsonmodelserialiser.cpp"
                         ,0xe);
  if (cVar1 != '\0') {
    (**(code **)(*(long *)this_00 + 0x20))(this_00);
    QTest::qCompare(testItemDestroyedSpy.super_QList<QList<QVariant>_>.d.size,1,
                    "testItemDestroyedSpy.count()","1",
                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_JsonModelSerialiser/tst_jsonmodelserialiser.cpp"
                    ,0x10);
  }
  QSignalSpy::~QSignalSpy(&testItemDestroyedSpy);
  return;
}

Assistant:

void tst_JsonModelSerialiser::autoParent()
{
    QObject *parentObj = new QObject;
    auto testItem = new JsonModelSerialiser(parentObj);
    QSignalSpy testItemDestroyedSpy(testItem, SIGNAL(destroyed(QObject *)));
    QVERIFY(testItemDestroyedSpy.isValid());
    delete parentObj;
    QCOMPARE(testItemDestroyedSpy.count(), 1);
}